

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

IXML_Attr * ixmlElement_getAttributeNode(IXML_Element *element,char *name)

{
  int iVar1;
  IXML_Element *local_28;
  IXML_Node *attrNode;
  char *name_local;
  IXML_Element *element_local;
  
  if ((element == (IXML_Element *)0x0) || (name == (char *)0x0)) {
    element_local = (IXML_Element *)0x0;
  }
  else {
    local_28 = (IXML_Element *)(element->n).firstAttr;
    while ((local_28 != (IXML_Element *)0x0 &&
           (iVar1 = strcmp((local_28->n).nodeName,name), iVar1 != 0))) {
      local_28 = (IXML_Element *)(local_28->n).nextSibling;
    }
    element_local = local_28;
  }
  return (IXML_Attr *)element_local;
}

Assistant:

IXML_Attr *ixmlElement_getAttributeNode(
	IXML_Element *element, const DOMString name)
{
	IXML_Node *attrNode;

	if (element == NULL || name == NULL) {
		return NULL;
	}

	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->nodeName, name) == 0) {
			/* found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}

	return (IXML_Attr *)attrNode;
}